

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimInfo.cpp
# Opt level: O3

void __thiscall OpenMD::SimInfo::prepareTopology(SimInfo *this)

{
  _Rb_tree_header *p_Var1;
  pointer pdVar2;
  _Base_ptr p_Var3;
  CutoffGroup *this_00;
  pointer ppAVar4;
  pointer piVar5;
  _Base_ptr p_Var6;
  iterator iVar7;
  ulong uVar8;
  pointer ppAVar9;
  _Rb_tree_node_base *p_Var10;
  _Base_ptr p_Var11;
  Atom *pAVar12;
  RealType RVar13;
  double dVar14;
  int reg;
  undefined8 local_40;
  int local_34;
  
  pdVar2 = (this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_finish != pdVar2) {
    (this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
    super__Vector_impl_data._M_finish = pdVar2;
  }
  local_40 = 1.0;
  std::vector<double,_std::allocator<double>_>::resize
            (&this->massFactors_,(ulong)(uint)this->nAtoms_,(value_type_conflict *)&local_40);
  p_Var1 = &(this->molecules_)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var10 = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      ((_Rb_tree_header *)p_Var10 != p_Var1 &&
      (p_Var3 = p_Var10[1]._M_parent, p_Var3 != (_Base_ptr)0x0));
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10)) {
    for (p_Var11 = p_Var3[5]._M_right;
        (p_Var11 != *(_Base_ptr *)(p_Var3 + 6) &&
        (this_00 = *(CutoffGroup **)p_Var11, this_00 != (CutoffGroup *)0x0));
        p_Var11 = (_Base_ptr)&p_Var11->_M_parent) {
      RVar13 = CutoffGroup::getMass(this_00);
      ppAVar9 = (this_00->cutoffAtomList).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppAVar4 = (this_00->cutoffAtomList).
                super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ppAVar9 != ppAVar4) && (pAVar12 = *ppAVar9, pAVar12 != (Atom *)0x0)) {
        pdVar2 = (this->massFactors_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          ppAVar9 = ppAVar9 + 1;
          dVar14 = 1.0;
          if ((RVar13 != 0.0) || (NAN(RVar13))) {
            dVar14 = (pAVar12->super_StuntDouble).mass_ / RVar13;
          }
          pdVar2[(pAVar12->super_StuntDouble).localIndex_] = dVar14;
        } while ((ppAVar9 != ppAVar4) && (pAVar12 = *ppAVar9, pAVar12 != (Atom *)0x0));
      }
    }
  }
  piVar5 = (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish != piVar5) {
    (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
    super__Vector_impl_data._M_finish = piVar5;
  }
  std::vector<int,_std::allocator<int>_>::reserve(&this->identArray_,(ulong)(uint)this->nAtoms_);
  piVar5 = (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if ((this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
      ._M_finish != piVar5) {
    (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = piVar5;
  }
  std::vector<int,_std::allocator<int>_>::reserve(&this->regions_,(ulong)(uint)this->nAtoms_);
  p_Var10 = (this->molecules_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (((_Rb_tree_header *)p_Var10 == p_Var1) ||
       (p_Var3 = p_Var10[1]._M_parent, p_Var3 == (_Base_ptr)0x0)) {
      this->topologyDone_ = true;
      return;
    }
    uVar8 = (ulong)local_40 >> 0x20;
    local_40 = (value_type_conflict)
               CONCAT44((int)uVar8,*(undefined4 *)((long)&p_Var3[0xc]._M_parent[0xf]._M_left + 4));
    p_Var11 = p_Var3->_M_left;
    if (p_Var11 != p_Var3->_M_right) {
      p_Var6 = *(_Base_ptr *)p_Var11;
      while (p_Var6 != (_Base_ptr)0x0) {
        p_Var11 = (_Base_ptr)&p_Var11->_M_parent;
        local_34 = AtomType::getIdent((AtomType *)p_Var6[3]._M_right);
        iVar7._M_current =
             (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                    (&this->identArray_,iVar7,&local_34);
        }
        else {
          *iVar7._M_current = local_34;
          (this->identArray_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        iVar7._M_current =
             (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar7._M_current ==
            (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    ((vector<int,std::allocator<int>> *)&this->regions_,iVar7,(int *)&local_40);
        }
        else {
          *iVar7._M_current = (int)local_40;
          (this->regions_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar7._M_current + 1;
        }
        if (p_Var11 == p_Var3->_M_right) break;
        p_Var6 = *(_Base_ptr *)p_Var11;
      }
    }
    p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
  } while( true );
}

Assistant:

void SimInfo::prepareTopology() {
    // calculate mass ratio of cutoff group
    SimInfo::MoleculeIterator mi;
    Molecule* mol;
    Molecule::CutoffGroupIterator ci;
    CutoffGroup* cg;
    Molecule::AtomIterator ai;
    Atom* atom;
    RealType totalMass;

    /**
     * The mass factor is the relative mass of an atom to the total
     * mass of the cutoff group it belongs to.  By default, all atoms
     * are their own cutoff groups, and therefore have mass factors of
     * 1.  We need some special handling for massless atoms, which
     * will be treated as carrying the entire mass of the cutoff
     * group.
     */
    massFactors_.clear();
    massFactors_.resize(getNAtoms(), 1.0);

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      for (cg = mol->beginCutoffGroup(ci); cg != NULL;
           cg = mol->nextCutoffGroup(ci)) {
        totalMass = cg->getMass();
        for (atom = cg->beginAtom(ai); atom != NULL; atom = cg->nextAtom(ai)) {
          // Check for massless groups - set mfact to 1 if true
          if (totalMass != 0)
            massFactors_[atom->getLocalIndex()] = atom->getMass() / totalMass;
          else
            massFactors_[atom->getLocalIndex()] = 1.0;
        }
      }
    }

    // Build the identArray_ and regions_

    identArray_.clear();
    identArray_.reserve(getNAtoms());
    regions_.clear();
    regions_.reserve(getNAtoms());

    for (mol = beginMolecule(mi); mol != NULL; mol = nextMolecule(mi)) {
      int reg = mol->getRegion();
      for (atom = mol->beginAtom(ai); atom != NULL; atom = mol->nextAtom(ai)) {
        identArray_.push_back(atom->getIdent());
        regions_.push_back(reg);
      }
    }

    topologyDone_ = true;
  }